

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NetworkUpdateParameters::MergeFrom
          (NetworkUpdateParameters *this,NetworkUpdateParameters *from)

{
  bool bVar1;
  LogMessage *other;
  Optimizer *this_00;
  Optimizer *from_00;
  BoolParameter *this_01;
  BoolParameter *from_01;
  Int64Parameter *pIVar2;
  Int64Parameter *pIVar3;
  InternalMetadataWithArenaLite *this_02;
  LogFinisher local_a5;
  uint32 cached_has_bits;
  byte local_91;
  LogMessage local_90;
  NetworkUpdateParameters *local_58;
  NetworkUpdateParameters *from_local;
  NetworkUpdateParameters *this_local;
  InternalMetadataWithArenaLite *local_40;
  InternalMetadataWithArenaLite *local_38;
  InternalMetadataWithArenaLite *local_30;
  InternalMetadataWithArenaLite *local_28;
  Container *local_20;
  InternalMetadataWithArenaLite *local_18;
  InternalMetadataWithArenaLite *local_10;
  
  local_91 = 0;
  local_58 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x11c7a);
    local_91 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_a5,other);
  }
  if ((local_91 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_02 = &this->_internal_metadata_;
  this_local = (NetworkUpdateParameters *)&local_58->_internal_metadata_;
  local_40 = this_02;
  local_38 = (InternalMetadataWithArenaLite *)this_local;
  local_30 = (InternalMetadataWithArenaLite *)this_local;
  if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArenaLite *)this_local;
    local_18 = (InternalMetadataWithArenaLite *)this_local;
    local_10 = (InternalMetadataWithArenaLite *)this_local;
    if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_local);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (this_02,&local_20->unknown_fields);
  }
  google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::MergeFrom
            (&this->losslayers_,&local_58->losslayers_);
  bVar1 = has_optimizer(local_58);
  if (bVar1) {
    this_00 = mutable_optimizer(this);
    from_00 = optimizer(local_58);
    Optimizer::MergeFrom(this_00,from_00);
  }
  bVar1 = has_epochs(local_58);
  if (bVar1) {
    pIVar2 = mutable_epochs(this);
    pIVar3 = epochs(local_58);
    Int64Parameter::MergeFrom(pIVar2,pIVar3);
  }
  bVar1 = has_shuffle(local_58);
  if (bVar1) {
    this_01 = mutable_shuffle(this);
    from_01 = shuffle(local_58);
    BoolParameter::MergeFrom(this_01,from_01);
  }
  bVar1 = has_seed(local_58);
  if (bVar1) {
    pIVar2 = mutable_seed(this);
    pIVar3 = seed(local_58);
    Int64Parameter::MergeFrom(pIVar2,pIVar3);
  }
  return;
}

Assistant:

void NetworkUpdateParameters::MergeFrom(const NetworkUpdateParameters& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NetworkUpdateParameters)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  losslayers_.MergeFrom(from.losslayers_);
  if (from.has_optimizer()) {
    mutable_optimizer()->::CoreML::Specification::Optimizer::MergeFrom(from.optimizer());
  }
  if (from.has_epochs()) {
    mutable_epochs()->::CoreML::Specification::Int64Parameter::MergeFrom(from.epochs());
  }
  if (from.has_shuffle()) {
    mutable_shuffle()->::CoreML::Specification::BoolParameter::MergeFrom(from.shuffle());
  }
  if (from.has_seed()) {
    mutable_seed()->::CoreML::Specification::Int64Parameter::MergeFrom(from.seed());
  }
}